

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O2

void __thiscall QSupportedWritingSystems::detach(QSupportedWritingSystems *this)

{
  QWritingSystemsPrivate *pQVar1;
  QWritingSystemsPrivate *this_00;
  
  pQVar1 = this->d;
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 1) {
    this_00 = (QWritingSystemsPrivate *)operator_new(0x20);
    QWritingSystemsPrivate::QWritingSystemsPrivate(this_00,pQVar1);
    pQVar1 = this->d;
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pQVar1 = this->d;
      if (pQVar1 != (QWritingSystemsPrivate *)0x0) {
        QArrayDataPointer<bool>::~QArrayDataPointer(&(pQVar1->list).d);
      }
      operator_delete(pQVar1,0x20);
    }
    this->d = this_00;
  }
  return;
}

Assistant:

void QSupportedWritingSystems::detach()
{
    if (d->ref.loadRelaxed() != 1) {
        QWritingSystemsPrivate *newd = new QWritingSystemsPrivate(d);
        if (!d->ref.deref())
            delete d;
        d = newd;
    }
}